

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint unfilter(uchar *out,uchar *in,uint w,uint h,uint bpp)

{
  long lVar1;
  byte bVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uchar *puVar11;
  long lVar12;
  byte bVar13;
  byte bVar14;
  ulong uVar15;
  uint uVar16;
  uchar *puVar17;
  long lVar18;
  ulong uVar19;
  uchar *puVar20;
  byte *pbVar21;
  ulong uVar22;
  uchar *puVar23;
  byte bVar24;
  long lVar25;
  long lVar26;
  uint uVar27;
  byte bVar29;
  uchar *puVar30;
  ulong uVar31;
  uint uVar32;
  uchar *puVar33;
  byte bVar34;
  byte bVar35;
  uint uVar36;
  uchar *puVar38;
  long local_c0;
  uint local_b8;
  uchar *local_a0;
  uint local_70;
  ulong uVar28;
  ulong uVar37;
  
  if (h == 0) {
    return 0;
  }
  uVar6 = bpp + 7;
  uVar27 = uVar6 >> 3;
  uVar28 = (ulong)uVar27;
  uVar16 = w * bpp + 7;
  uVar36 = uVar16 >> 3;
  uVar37 = (ulong)uVar36;
  lVar1 = uVar37 + 1;
  local_70 = uVar27 + 2;
  puVar38 = in + 1;
  local_a0 = in + 3;
  lVar10 = -uVar28;
  local_c0 = (long)out - uVar28;
  puVar17 = in + 4;
  puVar11 = out + uVar28 + 3;
  lVar18 = uVar37 - uVar28;
  puVar30 = in + uVar28 + 4;
  puVar33 = out + uVar28;
  puVar20 = in + uVar28 + 1;
  uVar22 = 0;
  pbVar21 = (byte *)0x0;
  puVar23 = out;
  do {
    if (4 < in[lVar1 * uVar22]) {
      return 0x24;
    }
    lVar25 = uVar22 * uVar37;
    switch(in[lVar1 * uVar22]) {
    case '\0':
      if (7 < uVar16) {
        uVar15 = 0;
        do {
          puVar23[uVar15] = puVar38[uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar37 != uVar15);
      }
      break;
    case '\x01':
      if (7 < uVar6) {
        uVar15 = 0;
        do {
          puVar23[uVar15] = puVar38[uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar28 != uVar15);
      }
      if (uVar27 < uVar36) {
        lVar26 = 0;
        do {
          puVar33[lVar26] = puVar23[lVar26] + puVar20[lVar26];
          lVar26 = lVar26 + 1;
        } while (lVar18 != lVar26);
      }
      break;
    case '\x02':
      if (pbVar21 == (byte *)0x0) {
        if (7 < uVar16) {
          uVar15 = 0;
          do {
            puVar23[uVar15] = puVar38[uVar15];
            uVar15 = uVar15 + 1;
          } while (uVar37 != uVar15);
        }
      }
      else if (7 < uVar16) {
        uVar15 = 0;
        do {
          puVar23[uVar15] = pbVar21[uVar15] + puVar38[uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar37 != uVar15);
      }
      break;
    case '\x03':
      if (pbVar21 == (byte *)0x0) {
        if (7 < uVar6) {
          uVar15 = 0;
          do {
            puVar23[uVar15] = puVar38[uVar15];
            uVar15 = uVar15 + 1;
          } while (uVar28 != uVar15);
        }
        if (uVar27 < uVar36) {
          lVar26 = 0;
          do {
            puVar33[lVar26] = (puVar23[lVar26] >> 1) + puVar20[lVar26];
            lVar26 = lVar26 + 1;
          } while (lVar18 != lVar26);
        }
      }
      else {
        if (7 < uVar6) {
          uVar15 = 0;
          do {
            puVar23[uVar15] = (pbVar21[uVar15] >> 1) + puVar38[uVar15];
            uVar15 = uVar15 + 1;
          } while (uVar28 != uVar15);
        }
        if (uVar27 < uVar36) {
          lVar26 = 0;
          do {
            puVar33[lVar26] =
                 (char)((uint)pbVar21[lVar26 + uVar28] + (uint)puVar23[lVar26] >> 1) +
                 puVar20[lVar26];
            lVar26 = lVar26 + 1;
          } while (lVar18 != lVar26);
        }
      }
      break;
    case '\x04':
      if (pbVar21 == (byte *)0x0) {
        if (7 < uVar6) {
          uVar15 = 0;
          do {
            puVar23[uVar15] = puVar38[uVar15];
            uVar15 = uVar15 + 1;
          } while (uVar28 != uVar15);
        }
        if (uVar27 < uVar36) {
          lVar26 = 0;
          do {
            puVar33[lVar26] = puVar23[lVar26] + puVar20[lVar26];
            lVar26 = lVar26 + 1;
          } while (lVar18 != lVar26);
        }
      }
      else {
        if (uVar6 < 8) {
          uVar15 = 0;
        }
        else {
          uVar15 = 0;
          do {
            puVar23[uVar15] = pbVar21[uVar15] + puVar38[uVar15];
            uVar15 = uVar15 + 1;
          } while (uVar28 != uVar15);
          uVar15 = uVar28;
          if (uVar6 < 0x20) {
            if (uVar27 == 3) {
              uVar15 = 3;
              if (local_70 < uVar36) {
                bVar24 = out[lVar25];
                uVar19 = 3;
                do {
                  bVar29 = pbVar21[uVar19];
                  bVar34 = pbVar21[uVar19 - 3];
                  uVar7 = (uint)bVar29 - (uint)bVar34;
                  uVar32 = -uVar7;
                  if (0 < (int)uVar7) {
                    uVar32 = uVar7;
                  }
                  uVar8 = (uint)bVar24 - (uint)bVar34;
                  uVar7 = -uVar8;
                  if (0 < (int)uVar8) {
                    uVar7 = uVar8;
                  }
                  uVar9 = (uint)bVar29 + (uint)bVar24 + (uint)bVar34 * -2;
                  uVar8 = -uVar9;
                  if (0 < (int)uVar9) {
                    uVar8 = uVar9;
                  }
                  uVar9 = uVar7 & 0xff;
                  if ((uVar32 & 0xff) <= (uVar7 & 0xff)) {
                    uVar9 = uVar32 & 0xff;
                    bVar29 = bVar24;
                  }
                  if (uVar9 <= uVar8) {
                    bVar34 = bVar29;
                  }
                  bVar29 = puVar23[uVar19 - 2];
                  bVar14 = pbVar21[uVar19 + 1];
                  bVar35 = pbVar21[uVar19 + 2];
                  bVar13 = pbVar21[uVar19 - 2];
                  bVar24 = bVar34 + puVar17[uVar19 - 3];
                  uVar7 = (uint)bVar14 - (uint)bVar13;
                  uVar32 = -uVar7;
                  if (0 < (int)uVar7) {
                    uVar32 = uVar7;
                  }
                  uVar32 = uVar32 & 0xff;
                  uVar8 = (uint)bVar29 - (uint)bVar13;
                  uVar7 = -uVar8;
                  if (0 < (int)uVar8) {
                    uVar7 = uVar8;
                  }
                  uVar9 = (uint)bVar14 + (uint)bVar29 + (uint)bVar13 * -2;
                  uVar8 = -uVar9;
                  if (0 < (int)uVar9) {
                    uVar8 = uVar9;
                  }
                  if ((uVar7 & 0xff) < uVar32) {
                    bVar29 = bVar14;
                    uVar32 = uVar7 & 0xff;
                  }
                  bVar34 = pbVar21[uVar19 - 1];
                  if (uVar8 < uVar32) {
                    bVar29 = bVar13;
                  }
                  uVar3 = puVar17[uVar19 - 2];
                  uVar7 = (uint)bVar35 - (uint)bVar34;
                  uVar32 = -uVar7;
                  if (0 < (int)uVar7) {
                    uVar32 = uVar7;
                  }
                  bVar14 = puVar23[uVar19 - 1];
                  uVar32 = uVar32 & 0xff;
                  uVar8 = (uint)bVar14 - (uint)bVar34;
                  uVar7 = -uVar8;
                  if (0 < (int)uVar8) {
                    uVar7 = uVar8;
                  }
                  uVar9 = (uint)bVar35 + (uint)bVar14 + (uint)bVar34 * -2;
                  uVar8 = -uVar9;
                  if (0 < (int)uVar9) {
                    uVar8 = uVar9;
                  }
                  if ((uVar7 & 0xff) < uVar32) {
                    bVar14 = bVar35;
                    uVar32 = uVar7 & 0xff;
                  }
                  if (uVar8 < uVar32) {
                    bVar14 = bVar34;
                  }
                  uVar4 = puVar17[uVar19 - 1];
                  puVar23[uVar19] = bVar24;
                  puVar23[uVar19 + 1] = bVar29 + uVar3;
                  puVar23[uVar19 + 2] = bVar14 + uVar4;
                  uVar15 = uVar19 + 3;
                  uVar31 = uVar19 + 5;
                  uVar19 = uVar15;
                } while (uVar31 < uVar37);
              }
            }
            else if (uVar28 + 1 < uVar37 && uVar27 != 1) {
              uVar19 = 2;
              do {
                bVar24 = *(byte *)(local_c0 + uVar19);
                bVar29 = *(byte *)(local_c0 + 1 + uVar19);
                bVar34 = pbVar21[uVar19];
                bVar14 = pbVar21[uVar19 + lVar10];
                uVar7 = (uint)bVar34 - (uint)bVar14;
                uVar32 = -uVar7;
                if (0 < (int)uVar7) {
                  uVar32 = uVar7;
                }
                uVar32 = uVar32 & 0xff;
                uVar8 = (uint)bVar24 - (uint)bVar14;
                uVar7 = -uVar8;
                if (0 < (int)uVar8) {
                  uVar7 = uVar8;
                }
                uVar9 = (uint)bVar34 + (uint)bVar24 + (uint)bVar14 * -2;
                uVar8 = -uVar9;
                if (0 < (int)uVar9) {
                  uVar8 = uVar9;
                }
                bVar35 = pbVar21[uVar19 + 1];
                if ((uVar7 & 0xff) < uVar32) {
                  bVar24 = bVar34;
                  uVar32 = uVar7 & 0xff;
                }
                bVar34 = pbVar21[uVar19 + lVar10 + 1];
                if (uVar8 < uVar32) {
                  bVar24 = bVar14;
                }
                uVar7 = (uint)bVar35 - (uint)bVar34;
                uVar32 = -uVar7;
                if (0 < (int)uVar7) {
                  uVar32 = uVar7;
                }
                uVar32 = uVar32 & 0xff;
                uVar8 = (uint)bVar29 - (uint)bVar34;
                uVar7 = -uVar8;
                if (0 < (int)uVar8) {
                  uVar7 = uVar8;
                }
                uVar9 = (uint)bVar35 + (uint)bVar29 + (uint)bVar34 * -2;
                uVar8 = -uVar9;
                if (0 < (int)uVar9) {
                  uVar8 = uVar9;
                }
                if ((uVar7 & 0xff) < uVar32) {
                  bVar29 = bVar35;
                  uVar32 = uVar7 & 0xff;
                }
                if (uVar8 < uVar32) {
                  bVar29 = bVar34;
                }
                uVar3 = local_a0[uVar19 - 1];
                puVar23[uVar19] = bVar24 + local_a0[uVar19 - 2];
                puVar23[uVar19 + 1] = bVar29 + uVar3;
                uVar15 = uVar19 + 2;
                uVar31 = uVar19 + 3;
                uVar19 = uVar15;
              } while (uVar31 < uVar37);
            }
          }
          else {
            local_b8 = (uint)(uVar28 + 3);
            if (local_b8 < uVar36) {
              lVar26 = 0;
              do {
                bVar24 = puVar23[lVar26];
                bVar29 = puVar23[lVar26 + 1];
                bVar34 = pbVar21[lVar26 + uVar28];
                bVar14 = pbVar21[lVar26];
                uVar7 = (uint)bVar34 - (uint)bVar14;
                uVar32 = -uVar7;
                if (0 < (int)uVar7) {
                  uVar32 = uVar7;
                }
                bVar35 = puVar23[lVar26 + 2];
                uVar32 = uVar32 & 0xff;
                uVar8 = (uint)bVar24 - (uint)bVar14;
                uVar7 = -uVar8;
                if (0 < (int)uVar8) {
                  uVar7 = uVar8;
                }
                uVar7 = uVar7 & 0xff;
                uVar9 = (uint)bVar24 + (uint)bVar34 + (uint)bVar14 * -2;
                uVar8 = -uVar9;
                if (0 < (int)uVar9) {
                  uVar8 = uVar9;
                }
                bVar13 = pbVar21[lVar26 + uVar28 + 1];
                uVar9 = uVar7;
                if (uVar32 <= uVar7) {
                  uVar9 = uVar32;
                }
                bVar2 = pbVar21[lVar26 + uVar28 + 2];
                if (uVar32 > uVar7) {
                  bVar24 = bVar34;
                }
                if (uVar8 < uVar9) {
                  bVar24 = bVar14;
                }
                bVar34 = pbVar21[lVar26 + 1];
                uVar7 = (uint)bVar13 - (uint)bVar34;
                uVar32 = -uVar7;
                if (0 < (int)uVar7) {
                  uVar32 = uVar7;
                }
                uVar32 = uVar32 & 0xff;
                uVar8 = (uint)bVar29 - (uint)bVar34;
                uVar7 = -uVar8;
                if (0 < (int)uVar8) {
                  uVar7 = uVar8;
                }
                uVar9 = (uint)bVar13 + (uint)bVar29 + (uint)bVar34 * -2;
                uVar8 = -uVar9;
                if (0 < (int)uVar9) {
                  uVar8 = uVar9;
                }
                bVar14 = pbVar21[lVar26 + uVar28 + 3];
                if ((uVar7 & 0xff) < uVar32) {
                  bVar29 = bVar13;
                  uVar32 = uVar7 & 0xff;
                }
                bVar13 = pbVar21[lVar26 + 2];
                if (uVar8 < uVar32) {
                  bVar29 = bVar34;
                }
                uVar3 = puVar30[lVar26 + -2];
                uVar7 = (uint)bVar2 - (uint)bVar13;
                uVar32 = -uVar7;
                if (0 < (int)uVar7) {
                  uVar32 = uVar7;
                }
                uVar32 = uVar32 & 0xff;
                uVar8 = (uint)bVar35 - (uint)bVar13;
                uVar7 = -uVar8;
                if (0 < (int)uVar8) {
                  uVar7 = uVar8;
                }
                uVar9 = (uint)bVar2 + (uint)bVar35 + (uint)bVar13 * -2;
                uVar8 = -uVar9;
                if (0 < (int)uVar9) {
                  uVar8 = uVar9;
                }
                if ((uVar7 & 0xff) < uVar32) {
                  bVar35 = bVar2;
                  uVar32 = uVar7 & 0xff;
                }
                bVar34 = pbVar21[lVar26 + 3];
                if (uVar8 < uVar32) {
                  bVar35 = bVar13;
                }
                uVar4 = puVar30[lVar26 + -1];
                uVar7 = (uint)bVar14 - (uint)bVar34;
                uVar32 = -uVar7;
                if (0 < (int)uVar7) {
                  uVar32 = uVar7;
                }
                bVar13 = puVar23[lVar26 + 3];
                uVar32 = uVar32 & 0xff;
                uVar8 = (uint)bVar13 - (uint)bVar34;
                uVar7 = -uVar8;
                if (0 < (int)uVar8) {
                  uVar7 = uVar8;
                }
                uVar9 = (uint)bVar13 + (uint)bVar14 + (uint)bVar34 * -2;
                uVar8 = -uVar9;
                if (0 < (int)uVar9) {
                  uVar8 = uVar9;
                }
                if ((uVar7 & 0xff) < uVar32) {
                  bVar13 = bVar14;
                  uVar32 = uVar7 & 0xff;
                }
                if (uVar8 < uVar32) {
                  bVar13 = bVar34;
                }
                uVar5 = puVar30[lVar26];
                puVar11[lVar26 + -3] = bVar24 + puVar30[lVar26 + -3];
                puVar11[lVar26 + -2] = bVar29 + uVar3;
                puVar11[lVar26 + -1] = bVar35 + uVar4;
                puVar11[lVar26] = bVar13 + uVar5;
                lVar12 = uVar28 + lVar26;
                lVar26 = lVar26 + 4;
              } while (lVar12 + 7U < uVar37);
              uVar15 = lVar26 + uVar28;
            }
          }
        }
        for (; uVar15 != uVar37; uVar15 = uVar15 + 1) {
          bVar24 = pbVar21[uVar15];
          bVar29 = pbVar21[uVar15 + lVar10];
          uVar7 = (uint)bVar24 - (uint)bVar29;
          uVar32 = -uVar7;
          if (0 < (int)uVar7) {
            uVar32 = uVar7;
          }
          bVar34 = *(byte *)(local_c0 + uVar15);
          uVar32 = uVar32 & 0xff;
          uVar8 = (uint)bVar34 - (uint)bVar29;
          uVar7 = -uVar8;
          if (0 < (int)uVar8) {
            uVar7 = uVar8;
          }
          uVar9 = (uint)bVar24 + (uint)bVar34 + (uint)bVar29 * -2;
          uVar8 = -uVar9;
          if (0 < (int)uVar9) {
            uVar8 = uVar9;
          }
          if ((uVar7 & 0xff) < uVar32) {
            bVar34 = bVar24;
            uVar32 = uVar7 & 0xff;
          }
          if (uVar8 < uVar32) {
            bVar34 = bVar29;
          }
          puVar23[uVar15] = bVar34 + puVar38[uVar15];
        }
      }
    }
    uVar22 = uVar22 + 1;
    puVar23 = puVar23 + uVar37;
    puVar38 = puVar38 + lVar1;
    local_a0 = local_a0 + lVar1;
    local_c0 = local_c0 + uVar37;
    puVar17 = puVar17 + lVar1;
    puVar11 = puVar11 + uVar37;
    puVar30 = puVar30 + lVar1;
    puVar33 = puVar33 + uVar37;
    puVar20 = puVar20 + lVar1;
    pbVar21 = out + lVar25;
  } while (uVar22 != h);
  return 0;
}

Assistant:

static unsigned unfilter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h, unsigned bpp) {
  /*
  For PNG filter method 0
  this function unfilters a single image (e.g. without interlacing this is called once, with Adam7 seven times)
  out must have enough bytes allocated already, in must have the scanlines + 1 filtertype byte per scanline
  w and h are image dimensions or dimensions of reduced image, bpp is bits per pixel
  in and out are allowed to be the same memory address (but aren't the same size since in has the extra filter bytes)
  */

  unsigned y;
  unsigned char* prevline = 0;

  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7u) / 8u;
  size_t linebytes = (w * bpp + 7u) / 8u;

  for(y = 0; y < h; ++y) {
    size_t outindex = linebytes * y;
    size_t inindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
    unsigned char filterType = in[inindex];

    CERROR_TRY_RETURN(unfilterScanline(&out[outindex], &in[inindex + 1], prevline, bytewidth, filterType, linebytes));

    prevline = &out[outindex];
  }

  return 0;
}